

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpat.cpp
# Opt level: O0

void __thiscall CVmObjPattern::post_load_init(CVmObjPattern *this,vm_obj_id_t self)

{
  vm_val_t *pvVar1;
  char *pcVar2;
  vmobj_pat_ext *pvVar3;
  CVmObjPattern *in_RDI;
  re_compiled_pattern **in_stack_00000020;
  char *strval;
  vm_val_t *origval;
  undefined4 in_stack_00000038;
  undefined4 in_stack_ffffffffffffffb8;
  vm_obj_id_t in_stack_ffffffffffffffbc;
  CVmObjTable *in_stack_ffffffffffffffc0;
  
  pvVar1 = get_orig_str((CVmObjPattern *)0x32bdfc);
  if (pvVar1->typ == VM_OBJ) {
    CVmObjTable::ensure_post_load_init(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  get_orig_str((CVmObjPattern *)0x32be29);
  pcVar2 = vm_val_t::get_as_string
                     ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (pcVar2 != (char *)0x0) {
    pvVar3 = get_ext(in_RDI);
    if (pvVar3->pat != (re_compiled_pattern *)0x0) {
      get_ext(in_RDI);
      CRegexParser::free_pattern((re_compiled_pattern *)0x32be60);
    }
    vmb_get_len((char *)0x32be8a);
    get_ext(in_RDI);
    CRegexParser::compile_pattern
              ((CRegexParser *)CONCAT44(self,in_stack_00000038),(char *)origval,(size_t)strval,
               in_stack_00000020);
  }
  return;
}

Assistant:

void CVmObjPattern::post_load_init(VMG_ vm_obj_id_t self)
{
    /* make sure the original string object is initialized */
    const vm_val_t *origval = get_orig_str();
    if (origval->typ == VM_OBJ)
        G_obj_table->ensure_post_load_init(vmg_ origval->val.obj);

    /* get the string value */
    const char *strval = get_orig_str()->get_as_string(vmg0_);
    if (strval != 0)
    {
        /* if we already have a compiled pattern, delete it */
        if (get_ext()->pat != 0)
            CRegexParser::free_pattern(get_ext()->pat);

        /* compile the pattern and store the result */
        G_bif_tads_globals->rex_parser->compile_pattern(
            strval + VMB_LEN, vmb_get_len(strval), &get_ext()->pat);
    }
}